

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::NegativeArithmetic::Run(NegativeArithmetic *this)

{
  GLuint GVar1;
  int local_34;
  int local_30;
  GLint status;
  GLint status_comp;
  GLuint sh;
  char *glsl_fs1;
  char *glsl_vs;
  NegativeArithmetic *this_local;
  
  glsl_fs1 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
  ;
  _status_comp = 
  "#version 420 core\nlayout(location = 0) out uvec4 o_color[4];\nlayout(binding = 0, offset = 0) uniform atomic_uint ac_counter;\nvoid main() {\n  o_color[0] = ac_counter++;\n}"
  ;
  glsl_vs = (char *)this;
  GVar1 = glu::CallLogWrapper::glCreateProgram
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper);
  this->prog_ = GVar1;
  status = glu::CallLogWrapper::glCreateShader
                     (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x8b31);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_,status);
  glu::CallLogWrapper::glShaderSource
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             status,1,&glsl_fs1,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             status);
  glu::CallLogWrapper::glGetShaderiv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             status,0x8b81,&local_30);
  if (local_30 == 1) {
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               status);
    status = glu::CallLogWrapper::glCreateShader
                       (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x8b30);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_,status);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               status,1,(GLchar **)&status_comp,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               status);
    glu::CallLogWrapper::glGetShaderiv
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               status,0x8b81,&local_30);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               status);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_);
    glu::CallLogWrapper::glGetProgramiv
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               this->prog_,0x8b82,&local_34);
    if ((local_30 == 1) && (local_34 == 1)) {
      gl4cts::anon_unknown_0::Output
                ("Expected error during fragment shader compilation or linking.");
      this_local = (NegativeArithmetic *)&DAT_ffffffffffffffff;
    }
    else {
      this_local = (NegativeArithmetic *)0x0;
    }
  }
  else {
    gl4cts::anon_unknown_0::Output("Unexpected error during vertex shader compilation.");
    this_local = (NegativeArithmetic *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		// create program
		const char* glsl_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							  "  gl_Position = i_vertex;" NL "}";

		const char* glsl_fs1 = "#version 420 core" NL "layout(location = 0) out uvec4 o_color[4];" NL
							   "layout(binding = 0, offset = 0) uniform atomic_uint ac_counter;" NL "void main() {" NL
							   "  o_color[0] = ac_counter++;" NL "}";

		prog_ = glCreateProgram();

		GLuint sh = glCreateShader(GL_VERTEX_SHADER);
		glAttachShader(prog_, sh);
		glShaderSource(sh, 1, &glsl_vs, NULL);
		glCompileShader(sh);
		GLint status_comp;
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status_comp);
		if (status_comp != GL_TRUE)
		{
			Output("Unexpected error during vertex shader compilation.");
			return ERROR;
		}
		glDeleteShader(sh);

		sh = glCreateShader(GL_FRAGMENT_SHADER);
		glAttachShader(prog_, sh);
		glShaderSource(sh, 1, &glsl_fs1, NULL);
		glCompileShader(sh);
		glGetShaderiv(sh, GL_COMPILE_STATUS, &status_comp);
		glDeleteShader(sh);

		GLint status;
		glLinkProgram(prog_);
		glGetProgramiv(prog_, GL_LINK_STATUS, &status);
		if (status_comp == GL_TRUE && status == GL_TRUE)
		{
			Output("Expected error during fragment shader compilation or linking.");
			return ERROR;
		}
		return NO_ERROR;
	}